

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O0

Matrix33 *
AML::eulerAngleRatesMatrix_ZYZ(Matrix33 *__return_storage_ptr__,double phi,double theta,double psi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_98;
  double data [3] [3];
  double cscTheta;
  double sinTheta;
  double cosTheta;
  double sinPhi;
  double cosPhi;
  double psi_local;
  double theta_local;
  double phi_local;
  
  dVar1 = cos(phi);
  dVar2 = sin(phi);
  dVar3 = cos(theta);
  data[0][1] = sin(theta);
  dVar4 = 1.0 / data[0][1];
  local_98 = dVar1 * dVar3 * dVar4;
  data[0][0] = -dVar2 * dVar3 * dVar4;
  data[0][2] = dVar2 * data[0][1] * dVar4;
  data[1][0] = dVar1 * data[0][1] * dVar4;
  data[1][1] = 0.0;
  data[1][2] = -dVar1 * dVar4;
  data[2][0] = dVar2 * dVar4;
  data[2][1] = 0.0;
  Matrix33::Matrix33(__return_storage_ptr__,(double (*) [3])&local_98);
  return __return_storage_ptr__;
}

Assistant:

Matrix33 eulerAngleRatesMatrix_ZYZ(double phi, double theta, double psi)
    {
        const double cosPhi = cos(phi);
        const double sinPhi = sin(phi);
        const double cosTheta = cos(theta);
        const double sinTheta = sin(theta);
        const double cscTheta = 1.0 / sinTheta;

        double data[3][3] = { { cosPhi * cosTheta * cscTheta, -sinPhi * cosTheta * cscTheta, sinTheta },
                              { sinPhi * sinTheta * cscTheta, cosPhi * sinTheta * cscTheta, 0.0 },
                              { -cosPhi * cscTheta, sinPhi * cscTheta, 0.0 } };

        return Matrix33(data);
    }